

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProcessing.cpp
# Opt level: O2

void mergeRelatedLines(vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_> *lines,
                      Mat *img)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  int iVar7;
  pointer pVVar8;
  int iVar9;
  pointer pVVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar22 [16];
  undefined1 auVar25 [16];
  float p;
  int local_a0;
  int local_9c;
  int local_68;
  int local_58;
  undefined1 auVar14 [16];
  undefined1 auVar18 [16];
  undefined1 auVar21 [16];
  undefined1 auVar24 [16];
  undefined1 auVar16 [16];
  undefined1 auVar20 [16];
  undefined1 auVar23 [16];
  undefined1 auVar26 [16];
  
  pVVar10 = (lines->super__Vector_base<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pVVar8 = (lines->super__Vector_base<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pVVar10 == pVVar8) {
      return;
    }
    fVar13 = (pVVar10->super_Matx<float,_2,_1>).val[0];
    fVar12 = (pVVar10->super_Matx<float,_2,_1>).val[1];
    if ((((fVar13 != 0.0) || (NAN(fVar13))) || (fVar12 != -100.0)) || (NAN(fVar12))) {
      if ((fVar12 <= 0.7853982) || (2.3561945 <= fVar12)) {
        fVar11 = cosf(fVar12);
        local_58 = (int)(fVar13 / fVar11);
        local_a0 = **(int **)(img + 0x40);
        fVar11 = tanf(fVar12);
        fVar12 = cosf(fVar12);
        auVar19._4_4_ = extraout_XMM0_Db_02;
        auVar19._0_4_ = (float)-local_a0;
        auVar19._8_4_ = extraout_XMM0_Db_02;
        auVar19._12_4_ = extraout_XMM0_Dd_00;
        auVar18._8_8_ = auVar19._8_8_;
        auVar18._4_4_ = fVar13;
        auVar18._0_4_ = (float)-local_a0;
        auVar20._0_12_ = auVar18._0_12_;
        auVar20._12_4_ = 0;
        auVar17._4_4_ = fVar12;
        auVar17._0_4_ = fVar11;
        auVar17._8_4_ = extraout_XMM0_Db_03;
        auVar17._12_4_ = extraout_XMM0_Db_04;
        auVar17 = divps(auVar20,auVar17);
        local_9c = (int)(auVar17._4_4_ + auVar17._0_4_);
        local_68 = 0;
      }
      else {
        fVar11 = sinf(fVar12);
        local_68 = (int)(fVar13 / fVar11);
        local_9c = *(int *)(*(long *)(img + 0x40) + 4);
        fVar11 = tanf(fVar12);
        fVar12 = sinf(fVar12);
        auVar15._4_4_ = extraout_XMM0_Db;
        auVar15._0_4_ = (float)-local_9c;
        auVar15._8_4_ = extraout_XMM0_Db;
        auVar15._12_4_ = extraout_XMM0_Dd;
        auVar14._8_8_ = auVar15._8_8_;
        auVar14._4_4_ = fVar13;
        auVar14._0_4_ = (float)-local_9c;
        auVar16._0_12_ = auVar14._0_12_;
        auVar16._12_4_ = 0;
        auVar2._4_4_ = fVar12;
        auVar2._0_4_ = fVar11;
        auVar2._8_4_ = extraout_XMM0_Db_00;
        auVar2._12_4_ = extraout_XMM0_Db_01;
        auVar17 = divps(auVar16,auVar2);
        local_a0 = (int)(auVar17._4_4_ + auVar17._0_4_);
        local_58 = 0;
      }
      for (pVVar8 = (lines->
                    super__Vector_base<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pVVar8 != (lines->
                    super__Vector_base<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>).
                    _M_impl.super__Vector_impl_data._M_finish; pVVar8 = pVVar8 + 1) {
        fVar13 = (pVVar10->super_Matx<float,_2,_1>).val[0];
        fVar12 = (pVVar8->super_Matx<float,_2,_1>).val[0];
        if ((fVar13 != fVar12) || (NAN(fVar13) || NAN(fVar12))) {
LAB_0010b6c4:
          if ((ABS(fVar12 - fVar13) < 20.0) &&
             (fVar13 = (pVVar8->super_Matx<float,_2,_1>).val[1],
             ABS(fVar13 - (pVVar10->super_Matx<float,_2,_1>).val[1]) < 0.17453292)) {
            if ((fVar13 <= 0.7853982) || (2.3561945 <= fVar13)) {
              fVar11 = cosf(fVar13);
              iVar9 = (int)(fVar12 / fVar11);
              iVar5 = **(int **)(img + 0x40);
              fVar11 = tanf(fVar13);
              fVar13 = cosf(fVar13);
              auVar25._4_4_ = extraout_XMM0_Db_08;
              auVar25._0_4_ = (float)-iVar5;
              auVar25._8_4_ = extraout_XMM0_Db_08;
              auVar25._12_4_ = extraout_XMM0_Dd_02;
              auVar24._8_8_ = auVar25._8_8_;
              auVar24._4_4_ = fVar12;
              auVar24._0_4_ = (float)-iVar5;
              auVar26._0_12_ = auVar24._0_12_;
              auVar26._12_4_ = 0;
              auVar4._4_4_ = fVar13;
              auVar4._0_4_ = fVar11;
              auVar4._8_4_ = extraout_XMM0_Db_09;
              auVar4._12_4_ = extraout_XMM0_Db_10;
              auVar17 = divps(auVar26,auVar4);
              iVar6 = (int)(auVar17._4_4_ + auVar17._0_4_);
              iVar7 = 0;
            }
            else {
              fVar11 = sinf(fVar13);
              iVar7 = (int)(fVar12 / fVar11);
              iVar6 = *(int *)(*(long *)(img + 0x40) + 4);
              fVar11 = tanf(fVar13);
              fVar13 = sinf(fVar13);
              auVar22._4_4_ = extraout_XMM0_Db_05;
              auVar22._0_4_ = (float)-iVar6;
              auVar22._8_4_ = extraout_XMM0_Db_05;
              auVar22._12_4_ = extraout_XMM0_Dd_01;
              auVar21._8_8_ = auVar22._8_8_;
              auVar21._4_4_ = fVar12;
              auVar21._0_4_ = (float)-iVar6;
              auVar23._0_12_ = auVar21._0_12_;
              auVar23._12_4_ = 0;
              auVar3._4_4_ = fVar13;
              auVar3._0_4_ = fVar11;
              auVar3._8_4_ = extraout_XMM0_Db_06;
              auVar3._12_4_ = extraout_XMM0_Db_07;
              auVar17 = divps(auVar23,auVar3);
              iVar5 = (int)(auVar17._4_4_ + auVar17._0_4_);
              iVar9 = 0;
            }
            if (((double)(iVar9 - local_58) * (double)(iVar9 - local_58) +
                 (double)((iVar7 - local_68) * (iVar7 - local_68)) < 4096.0) &&
               ((double)(iVar6 - local_9c) * (double)(iVar6 - local_9c) +
                (double)((iVar5 - local_a0) * (iVar5 - local_a0)) < 4096.0)) {
              fVar13 = (pVVar10->super_Matx<float,_2,_1>).val[1];
              (pVVar10->super_Matx<float,_2,_1>).val[0] =
                   ((pVVar10->super_Matx<float,_2,_1>).val[0] +
                   (pVVar8->super_Matx<float,_2,_1>).val[0]) * 0.5;
              (pVVar10->super_Matx<float,_2,_1>).val[1] =
                   (fVar13 + (pVVar8->super_Matx<float,_2,_1>).val[1]) * 0.5;
              *(undefined8 *)(pVVar8->super_Matx<float,_2,_1>).val = 0xc2c8000000000000;
            }
          }
        }
        else {
          fVar11 = (pVVar10->super_Matx<float,_2,_1>).val[1];
          pfVar1 = (pVVar8->super_Matx<float,_2,_1>).val + 1;
          if ((fVar11 != *pfVar1) || (NAN(fVar11) || NAN(*pfVar1))) goto LAB_0010b6c4;
        }
      }
    }
    pVVar10 = pVVar10 + 1;
  } while( true );
}

Assistant:

void mergeRelatedLines(vector<Vec2f> *lines, Mat &img){
    vector<Vec2f>::iterator current;
    for(current=lines->begin();current!=lines->end();current++){
        if((*current)[0]==0 && (*current)[1]==-100) continue;
        float p1 = (*current)[0];
        float theta1 = (*current)[1];
        Point pt1current, pt2current;
        if(theta1>CV_PI*45/180 && theta1<CV_PI*135/180){
            pt1current.x=0;

            pt1current.y = p1/sin(theta1);

            pt2current.x=img.size().width;
            pt2current.y=-pt2current.x/tan(theta1) + p1/sin(theta1);
        }
        else{
            pt1current.y=0;

            pt1current.x=p1/cos(theta1);

            pt2current.y=img.size().height;
            pt2current.x=-pt2current.y/tan(theta1) + p1/cos(theta1);

        }
        vector<Vec2f>::iterator    pos;
        for(pos=lines->begin();pos!=lines->end();pos++){
            if(*current==*pos) continue;
            if(fabs((*pos)[0]-(*current)[0])<20 && fabs((*pos)[1]-(*current)[1])<CV_PI*10/180){
                float p = (*pos)[0];
                float theta = (*pos)[1];
                Point pt1, pt2;
                if((*pos)[1]>CV_PI*45/180 && (*pos)[1]<CV_PI*135/180){
                    pt1.x=0;
                    pt1.y = p/sin(theta);
                    pt2.x=img.size().width;
                    pt2.y=-pt2.x/tan(theta) + p/sin(theta);
                }
                else{
                    pt1.y=0;
                    pt1.x=p/cos(theta);
                    pt2.y=img.size().height;
                    pt2.x=-pt2.y/tan(theta) + p/cos(theta);
                }
                if(((double)(pt1.x-pt1current.x)*(pt1.x-pt1current.x) + (pt1.y-pt1current.y)*(pt1.y-pt1current.y)<64*64) &&
                    ((double)(pt2.x-pt2current.x)*(pt2.x-pt2current.x) + (pt2.y-pt2current.y)*(pt2.y-pt2current.y)<64*64))
                {
                    // Merge the two
                    (*current)[0] = ((*current)[0]+(*pos)[0])/2;

                    (*current)[1] = ((*current)[1]+(*pos)[1])/2;

                    (*pos)[0]=0;
                    (*pos)[1]=-100;
                }
            }
        }
    }
}